

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::find(Forth *this)

{
  byte bVar1;
  bool bVar2;
  uint pointer;
  Xt Value;
  Definition *this_00;
  Cell x;
  Xt word;
  CAddr name;
  Cell length;
  CAddr caddr;
  Forth *this_local;
  
  requireDStackDepth(this,1,"FIND");
  requireDStackAvailable(this,1,"FIND");
  pointer = ForthStack<unsigned_int>::getTop(&this->dStack);
  bVar1 = getDataChar(this,pointer);
  Value = findDefinition(this,pointer + 1,(uint)bVar1);
  if (Value == 0) {
    push(this,0);
  }
  else {
    ForthStack<unsigned_int>::setTop(&this->dStack,Value);
    this_00 = definitionsAt(this,Value);
    bVar2 = Definition::isImmediate(this_00);
    x = 0xffffffff;
    if (bVar2) {
      x = 1;
    }
    push(this,x);
  }
  return;
}

Assistant:

void find() {
			REQUIRE_DSTACK_DEPTH(1, "FIND");
			REQUIRE_DSTACK_AVAILABLE(1, "FIND");
			auto caddr = CADDR(dStack.getTop());
			auto length = static_cast<Cell>(getDataChar(caddr));
			auto name = caddr + 1;
			auto word = findDefinition(name, length);
			if (word == 0) {
				push(0);
			}
			else {
				dStack.setTop(CELL(word));
				push(definitionsAt(word).isImmediate() ? 1 : Cell(-1));
			}
		}